

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O2

void __thiscall UnitTest1::CodeGenTest::MatchCodeGenTest1(CodeGenTest *this)

{
  char *input;
  void *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  char str1 [43];
  MatchRoutineEM64T<char> match_routine;
  
  builtin_strncpy(str1 + 0x20," lazy dog.",0xb);
  builtin_strncpy(str1,"A quick brown fox jumps over the",0x20);
  std::__cxx11::string::string((string *)&local_248,str1,(allocator *)&local_250);
  Centaurus::MatchRoutineEM64T<char>::MatchRoutineEM64T(&match_routine,&local_248,(Logger *)0x0);
  std::__cxx11::string::~string((string *)&local_248);
  input = (char *)malloc(0x30);
  local_248._M_dataplus._M_p = input + 0x2a;
  *(undefined8 *)input = str1._0_8_;
  *(ulong *)(input + 8) = CONCAT53(str1._11_5_,str1._8_3_);
  *(ulong *)(input + 0x10) = CONCAT53(str1._19_5_,str1._16_3_);
  *(ulong *)(input + 0x18) = CONCAT53(str1._27_5_,str1._24_3_);
  *(ulong *)(input + 0xb) = CONCAT35(str1._16_3_,str1._11_5_);
  *(ulong *)(input + 0x13) = CONCAT35(str1._24_3_,str1._19_5_);
  *(ulong *)(input + 0x1b) = CONCAT35(str1._32_3_,str1._27_5_);
  *(undefined8 *)(input + 0x23) = str1._35_8_;
  local_250 = Centaurus::MatchRoutineEM64T<char>::operator()(&match_routine,input);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            ((void **)&local_248,&local_250,(wchar_t *)0x0);
  Centaurus::MatchRoutineEM64T<char>::~MatchRoutineEM64T(&match_routine);
  return;
}

Assistant:

TEST_METHOD(MatchCodeGenTest1)
    {
        using namespace Centaurus;

        const char str1[] = "A quick brown fox jumps over the lazy dog.";

        MatchRoutineEM64T<char> match_routine(str1);

        char *buf = (char *)malloc((sizeof(str1) + 15) / 16 * 16);
        memcpy(buf, str1, sizeof(str1));

        Assert::AreEqual((const void *)(buf + sizeof(str1) - 1), match_routine(buf));
    }